

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::Exception>::Maybe(Maybe<kj::Exception> *this,Maybe<kj::Exception> *other)

{
  NullableValue<kj::Exception> *other_00;
  Maybe<kj::Exception> *other_local;
  Maybe<kj::Exception> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::Exception>>(&other->ptr);
  kj::_::NullableValue<kj::Exception>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }